

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcSetSceneProgressMonitorFunction
               (RTCScene hscene,RTCProgressMonitorFunction progress,void *ptr)

{
  undefined8 *puVar1;
  DeviceEnterLeave enterleave;
  Lock<embree::MutexSys> lock;
  DeviceEnterLeave DStack_58;
  MutexSys *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 local_40 [16];
  
  if (hscene != (RTCScene)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&DStack_58,hscene);
    local_50 = &g_mutex;
    local_48 = 1;
    embree::MutexSys::lock(&g_mutex);
    embree::Scene::setProgressMonitorFunction((Scene *)hscene,progress,ptr);
    embree::MutexSys::unlock(&g_mutex);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&DStack_58);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50 = (MutexSys *)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 2),local_50,
             (undefined1 *)((long)local_50 + CONCAT71(uStack_47,local_48)));
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetSceneProgressMonitorFunction(RTCScene hscene, RTCProgressMonitorFunction progress, void* ptr) 
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetSceneProgressMonitorFunction);
    RTC_VERIFY_HANDLE(hscene);
    RTC_ENTER_DEVICE(hscene);
    Lock<MutexSys> lock(g_mutex);
    scene->setProgressMonitorFunction(progress,ptr);
    RTC_CATCH_END2(scene);
  }